

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall defval_ctx::add(defval_ctx *this,CTcSymLocal *l)

{
  int iVar1;
  CTcSymLocal **__src;
  CTcSymLocal **__dest;
  ulong uVar2;
  int iVar3;
  
  iVar3 = this->nv;
  if (iVar3 == this->nvalo) {
    uVar2 = 0xffffffffffffffff;
    if (-0x81 < iVar3) {
      uVar2 = (long)iVar3 * 8 + 0x400;
    }
    __dest = (CTcSymLocal **)operator_new__(uVar2);
    __src = this->v;
    memcpy(__dest,__src,(long)iVar3 * 8);
    iVar1 = iVar3;
    if (__src != (CTcSymLocal **)0x0) {
      operator_delete__(__src);
      iVar3 = this->nv;
      iVar1 = this->nvalo;
    }
    this->v = __dest;
    this->nvalo = iVar1 + 0x80;
  }
  else {
    __dest = this->v;
  }
  this->nv = iVar3 + 1;
  __dest[iVar3] = l;
  return;
}

Assistant:

void add(CTcSymLocal *l)
    {
        /* if there's not room, expand the array */
        if (nv == nvalo)
        {
            CTcSymLocal **vnew = new CTcSymLocal*[nvalo + 128];
            memcpy(vnew, v, nvalo * sizeof(*vnew));
            delete [] v;
            v = vnew;
            nvalo += 128;
        }

        /* add it */
        v[nv++] = l;
    }